

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O3

int pem_write_SSL_SESSION_i2d(void *x,uchar **outp)

{
  ulong __n;
  int iVar1;
  long lVar2;
  int iVar3;
  int iStack_20;
  undefined4 uStack_1c;
  uint8_t *puStack_18;
  
  iVar1 = SSL_SESSION_to_bytes((SSL_SESSION *)x,&puStack_18,(size_t *)&iStack_20);
  iVar3 = -1;
  if (iVar1 != 0) {
    __n = CONCAT44(uStack_1c,iStack_20);
    if ((__n & 0xffffffff80000000) == 0) {
      if (outp != (uchar **)0x0) {
        if (__n == 0) {
          lVar2 = 0;
        }
        else {
          memcpy(*outp,puStack_18,__n);
          lVar2 = CONCAT44(uStack_1c,iStack_20);
        }
        *outp = *outp + lVar2;
      }
      OPENSSL_free(puStack_18);
      iVar3 = iStack_20;
    }
    else {
      OPENSSL_free(puStack_18);
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                    ,0x300);
    }
  }
  return iVar3;
}

Assistant:

SSL_SESSION *d2i_SSL_SESSION(SSL_SESSION **a, const uint8_t **pp, long length) {
  if (length < 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *pp, length);

  UniquePtr<SSL_SESSION> ret = SSL_SESSION_parse(&cbs, &ssl_crypto_x509_method,
                                                 NULL /* no buffer pool */);
  if (!ret) {
    return NULL;
  }

  if (a) {
    SSL_SESSION_free(*a);
    *a = ret.get();
  }
  *pp = CBS_data(&cbs);
  return ret.release();
}